

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O2

void __thiscall cursespp::Window::Hide(Window *this)

{
  (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[8])();
  if (this->frame == (WINDOW *)0x0) {
    if (this->isVisibleInParent == false) goto LAB_001994d1;
  }
  else {
    if (this->isVisibleInParent == false) goto LAB_001994d1;
    (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x30])(this);
  }
  this->isVisibleInParent = false;
LAB_001994d1:
  NotifyVisibilityChange(this,false);
  return;
}

Assistant:

void Window::Hide() {
    ASSERT_MAIN_THREAD();

    this->Blur();

    if (this->frame) {
        if (this->isVisibleInParent) {
            this->Destroy();
            this->isVisibleInParent = false;
        }
    }
    else {
        if (this->isVisibleInParent) {
            this->isVisibleInParent = false;
        }
    }

    this->NotifyVisibilityChange(false);
}